

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::FastInstancesIterator::
FastInstancesIterator<Kernel::Literal*>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  (this->_subst)._boundVars._stack = (TermList *)0x0;
  (this->_subst)._boundVars._cursor = (TermList *)0x0;
  (this->_ldIterator)._core = (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)0x0;
  (this->_subst)._boundVars._capacity = 0;
  (this->_subst)._boundVars._end = (TermList *)0x0;
  (this->_subst)._bindings._timestamp = 1;
  (this->_subst)._bindings._size = 0;
  (this->_subst)._bindings._deleted = 0;
  (this->_subst)._bindings._capacityIndex = 0;
  (this->_subst)._bindings._capacity = 0;
  *(undefined8 *)&(this->_subst)._bindings._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_subst)._bindings._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_subst)._bindings._afterLast + 4) = 0x100000000;
  (this->_subst)._derefBindings._size = 0;
  (this->_subst)._derefBindings._deleted = 0;
  (this->_subst)._derefBindings._capacityIndex = 0;
  (this->_subst)._derefBindings._capacity = 0;
  *(undefined8 *)&(this->_subst)._derefBindings._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_subst)._derefBindings._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_subst)._derefBindings._afterLast + 4) = 0x100000000;
  (this->_resultDenormalizer)._data._size = 0;
  (this->_resultDenormalizer)._data._deleted = 0;
  (this->_resultDenormalizer)._data._capacityIndex = 0;
  (this->_resultDenormalizer)._data._capacity = 0;
  *(undefined8 *)&(this->_resultDenormalizer)._data._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_resultDenormalizer)._data._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_resultDenormalizer)._data._afterLast + 4) = 0;
  (this->_resultDenormalizer)._identity = true;
  (this->_alternatives)._capacity = 0;
  (this->_alternatives)._stack = (void **)0x0;
  (this->_alternatives)._cursor = (void **)0x0;
  (this->_alternatives)._end = (void **)0x0;
  (this->_specVarNumbers)._capacity = 0;
  (this->_specVarNumbers)._stack = (uint *)0x0;
  (this->_specVarNumbers)._cursor = (uint *)0x0;
  (this->_specVarNumbers)._end = (uint *)0x0;
  (this->_nodeTypes)._capacity = 0;
  (this->_nodeTypes)._stack = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._cursor = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._end = (NodeAlgorithm *)0x0;
  init<Kernel::Literal*>(this,parent,root,query,retrieveSubstitution,reversed);
  return;
}

Assistant:

FastInstancesIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      { init(parent,root,query,retrieveSubstitution,reversed); }